

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_fractional.c
# Opt level: O0

void WebRtcSpl_Resample32khzTo24khz(int32_t *In,int32_t *Out,size_t K)

{
  ulong uStack_28;
  int32_t tmp;
  size_t m;
  size_t K_local;
  int32_t *Out_local;
  int32_t *In_local;
  
  K_local = (size_t)Out;
  Out_local = In;
  for (uStack_28 = 0; uStack_28 < K; uStack_28 = uStack_28 + 1) {
    *(int32_t *)K_local =
         Out_local[7] * 0x5a +
         Out_local[6] * 0x2d1 +
         Out_local[5] * -0xefe +
         Out_local[4] * 0x297c +
         Out_local[3] * 0x5f56 +
         Out_local[2] * 0x982 + Out_local[1] * -0x93a + *Out_local * 0x2ff + 0x4000;
    *(int32_t *)(K_local + 4) =
         Out_local[8] * 0x182 +
         Out_local[7] * -0x17d +
         Out_local[6] * -0xa56 +
         Out_local[5] * 0x4a76 +
         Out_local[4] * 0x4a76 +
         Out_local[3] * -0xa56 + Out_local[2] * -0x17d + Out_local[1] * 0x182 + 0x4000;
    *(int32_t *)(K_local + 8) =
         Out_local[9] * 0x2ff +
         Out_local[8] * -0x93a +
         Out_local[7] * 0x982 +
         Out_local[6] * 0x5f56 +
         Out_local[5] * 0x297c +
         Out_local[4] * -0xefe + Out_local[3] * 0x2d1 + Out_local[2] * 0x5a + 0x4000;
    Out_local = Out_local + 4;
    K_local = K_local + 0xc;
  }
  return;
}

Assistant:

void WebRtcSpl_Resample32khzTo24khz(const int32_t *In, int32_t *Out, size_t K)
{
    /////////////////////////////////////////////////////////////
    // Filter operation:
    //
    // Perform resampling (4 input samples -> 3 output samples);
    // process in sub blocks of size 4 samples.
    size_t m;
    int32_t tmp;

    for (m = 0; m < K; m++)
    {
        tmp = 1 << 14;
        tmp += kCoefficients32To24[0][0] * In[0];
        tmp += kCoefficients32To24[0][1] * In[1];
        tmp += kCoefficients32To24[0][2] * In[2];
        tmp += kCoefficients32To24[0][3] * In[3];
        tmp += kCoefficients32To24[0][4] * In[4];
        tmp += kCoefficients32To24[0][5] * In[5];
        tmp += kCoefficients32To24[0][6] * In[6];
        tmp += kCoefficients32To24[0][7] * In[7];
        Out[0] = tmp;

        tmp = 1 << 14;
        tmp += kCoefficients32To24[1][0] * In[1];
        tmp += kCoefficients32To24[1][1] * In[2];
        tmp += kCoefficients32To24[1][2] * In[3];
        tmp += kCoefficients32To24[1][3] * In[4];
        tmp += kCoefficients32To24[1][4] * In[5];
        tmp += kCoefficients32To24[1][5] * In[6];
        tmp += kCoefficients32To24[1][6] * In[7];
        tmp += kCoefficients32To24[1][7] * In[8];
        Out[1] = tmp;

        tmp = 1 << 14;
        tmp += kCoefficients32To24[2][0] * In[2];
        tmp += kCoefficients32To24[2][1] * In[3];
        tmp += kCoefficients32To24[2][2] * In[4];
        tmp += kCoefficients32To24[2][3] * In[5];
        tmp += kCoefficients32To24[2][4] * In[6];
        tmp += kCoefficients32To24[2][5] * In[7];
        tmp += kCoefficients32To24[2][6] * In[8];
        tmp += kCoefficients32To24[2][7] * In[9];
        Out[2] = tmp;

        // update pointers
        In += 4;
        Out += 3;
    }
}